

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
          *handler)

{
  internal *__last;
  wchar_t wVar1;
  internal *piVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  internal *piVar4;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *this_00;
  internal *__last_00;
  char *message;
  wchar_t *begin;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *)format_str.size_;
  if (format_str.data_ == (wchar_t *)0x0) {
    return;
  }
  __last = this + (long)format_str.data_ * 4;
  do {
    wVar1 = *(wchar_t *)this;
    piVar2 = this;
    while (wVar1 != L'{') {
      piVar2 = piVar2 + 4;
      piVar4 = this;
      if (piVar2 == __last) goto LAB_001836a6;
      wVar1 = *(wchar_t *)piVar2;
    }
    piVar4 = this;
    if (this != piVar2) {
      do {
        while (__last_00 = this + 4, *(wchar_t *)this == L'}') {
          if ((__last_00 == piVar2) || (*(wchar_t *)__last_00 != L'}')) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001835a0;
          }
          bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                            ((wchar_t *)piVar4,(wchar_t *)__last_00,
                             (this_00->context).
                             super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                             .out_.container);
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
          .out_.container = bVar3.container;
          this = this + 8;
          piVar4 = this;
          if (this == piVar2) goto LAB_0018359c;
        }
        this = __last_00;
      } while (__last_00 != piVar2);
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        ((wchar_t *)piVar4,(wchar_t *)piVar2,
                         (this_00->context).
                         super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                         .out_.container);
LAB_0018359c:
      (this_00->context).
      super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
      .out_.container = bVar3.container;
    }
LAB_001835a0:
    piVar4 = piVar2 + 4;
    if (piVar4 == __last) {
      message = "invalid format string";
      goto LAB_00183704;
    }
    if ((char)*(wchar_t *)piVar4 == '}') {
      basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
      ::next_arg((format_arg *)&local_58.string,&this_00->context);
      (this_00->arg).type_ = local_48;
      (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
      (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001835d5:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ::on_replacement_field(this_00,(wchar_t *)piVar4);
    }
    else {
      if (*(wchar_t *)piVar4 != L'{') {
        local_58._0_8_ = this_00;
        piVar4 = (internal *)
                 parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar4,(wchar_t *)__last,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&,_wchar_t>
                             *)&local_58.string);
        if (piVar4 != __last) {
          if (*(wchar_t *)piVar4 == L':') {
            piVar4 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                     ::on_format_specs(this_00,(wchar_t *)(piVar4 + 4),(wchar_t *)__last);
            if ((piVar4 != __last) && (*(wchar_t *)piVar4 == L'}')) goto LAB_00183659;
            message = "unknown format specifier";
            goto LAB_00183704;
          }
          if (*(wchar_t *)piVar4 == L'}') goto LAB_001835d5;
        }
        message = "missing \'}\' in format string";
        goto LAB_00183704;
      }
      bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                        ((wchar_t *)piVar4,(wchar_t *)(piVar2 + 8),
                         (this_00->context).
                         super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                         .out_.container);
      (this_00->context).
      super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
      .out_.container = bVar3.container;
    }
LAB_00183659:
    this = piVar4 + 4;
    if (this == __last) {
      return;
    }
  } while( true );
LAB_001836a6:
  piVar2 = this + 4;
  if (*(wchar_t *)this == L'}') {
    if ((piVar2 == __last) || (*(int *)piVar2 != 0x7d)) {
      message = "unmatched \'}\' in format string";
LAB_00183704:
      error_handler::on_error((error_handler *)this_00,message);
      return;
    }
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                      ((wchar_t *)piVar4,(wchar_t *)piVar2,
                       (this_00->context).
                       super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                       .out_.container);
    (this_00->context).
    super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
    .out_.container = bVar3.container;
    this = this + 8;
    piVar4 = this;
    if (this == __last) goto LAB_001836d8;
    goto LAB_001836a6;
  }
  this = piVar2;
  if (piVar2 == __last) {
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                      ((wchar_t *)piVar4,(wchar_t *)__last,
                       (this_00->context).
                       super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                       .out_.container);
LAB_001836d8:
    (this_00->context).
    super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
    .out_.container = bVar3.container;
    return;
  }
  goto LAB_001836a6;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}